

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall t_rs_generator::generate_struct(t_rs_generator *this,t_struct *tstruct)

{
  int iVar1;
  undefined8 *puVar2;
  string sStack_38;
  
  if (tstruct->is_union_ == true) {
    render_union(this,tstruct);
    return;
  }
  iVar1 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[0xb])(tstruct);
  if ((char)iVar1 != '\0') {
    rust_struct_name_abi_cxx11_(&sStack_38,this,tstruct);
    render_struct(this,&sStack_38,tstruct,T_REGULAR);
    std::__cxx11::string::~string((string *)&sStack_38);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "cannot generate struct for exception";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

void t_rs_generator::generate_struct(t_struct* tstruct) {
  if (tstruct->is_union()) {
    render_union(tstruct);
  } else if (tstruct->is_struct()) {
    render_struct(rust_struct_name(tstruct), tstruct, t_rs_generator::T_REGULAR);
  } else {
    throw "cannot generate struct for exception";
  }
}